

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_loop_for_stmt(gvisitor_t *self,gnode_loop_stmt_t *node)

{
  gravity_function_t *f;
  ircode_t *code_00;
  gravity_vm *pgVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t p1;
  uint32_t p1_00;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t p1_01;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t p1_02;
  uint32_t p1_03;
  uint32_t p1_04;
  gravity_value_t gVar9;
  uint32_t local_2ac;
  uint32_t local_29c;
  uint32_t local_28c;
  uint32_t local_27c;
  uint32_t local_264;
  uint32_t local_24c;
  uint32_t local_234;
  uint32_t local_21c;
  uint32_t local_20c;
  uint32_t local_1f4;
  uint32_t local_1dc;
  uint32_t local_1c4;
  uint32_t local_1ac;
  uint32_t local_194;
  uint32_t local_184;
  uint32_t local_16c;
  uint32_t local_15c;
  uint32_t local_144;
  uint32_t local_12c;
  uint32_t local_114;
  uint32_t local_fc;
  uint32_t local_e4;
  uint32_t local_cc;
  uint32_t labelCheck;
  uint32_t labelFalse;
  uint32_t labelTrue;
  uint32_t temp;
  uint32_t temp3;
  uint32_t temp2;
  uint32_t temp1;
  uint32_t next_fn;
  uint32_t iterate_fn;
  uint32_t once_expr;
  uint32_t cond_idx;
  uint16_t next_idx;
  uint16_t iterate_idx;
  uint32_t _value;
  uint32_t _expr;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_loop_stmt_t *node_local;
  gvisitor_t *self_local;
  
  f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = *(ircode_t **)((long)&f->field_9 + 0x50);
    p1 = ircode_register_push_temp_protected(code_00);
    p1_00 = ircode_register_push_temp_protected(code_00);
    pgVar1 = *(gravity_vm **)((long)self->data + 0x38);
    gVar9 = gravity_string_to_value((gravity_vm *)0x0,"iterate",0xffffffff);
    uVar2 = gravity_function_cpool_add(pgVar1,f,gVar9);
    pgVar1 = *(gravity_vm **)((long)self->data + 0x38);
    gVar9 = gravity_string_to_value((gravity_vm *)0x0,"next",0xffffffff);
    uVar3 = gravity_function_cpool_add(pgVar1,f,gVar9);
    uVar4 = node2index(node->cond);
    gvisit(self,node->expr);
    uVar5 = ircode_register_pop(code_00);
    if (uVar5 == 0xffffffff) {
      report_error(self,&node->base,"Invalid for expression.");
    }
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_cc = 0;
    }
    else {
      local_cc = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,p1,uVar5,0,local_cc);
    uVar5 = ircode_register_push_temp_protected(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_e4 = 0;
    }
    else {
      local_e4 = (node->base).token.lineno;
    }
    ircode_add(code_00,LOADK,uVar5,(uint)uVar2,0,local_e4);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_fc = 0;
    }
    else {
      local_fc = (node->base).token.lineno;
    }
    ircode_add(code_00,LOAD,uVar5,p1,uVar5,local_fc);
    p1_01 = ircode_register_push_temp_protected(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_114 = 0;
    }
    else {
      local_114 = (node->base).token.lineno;
    }
    ircode_add(code_00,LOADK,p1_01,(uint)uVar3,0,local_114);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_12c = 0;
    }
    else {
      local_12c = (node->base).token.lineno;
    }
    ircode_add(code_00,LOAD,p1_01,p1,p1_01,local_12c);
    uVar6 = ircode_register_push_temp(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_144 = 0;
    }
    else {
      local_144 = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,uVar6,uVar5,0,local_144);
    uVar7 = ircode_register_push_temp(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_15c = 0;
    }
    else {
      local_15c = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,uVar7,p1,0,local_15c);
    uVar7 = ircode_register_push_temp(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_16c = 0;
    }
    else {
      local_16c = (node->base).token.lineno;
    }
    ircode_add(code_00,LOADK,uVar7,0x1002,0,local_16c);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_184 = 0;
    }
    else {
      local_184 = (node->base).token.lineno;
    }
    ircode_add(code_00,CALL,p1_00,uVar6,2,local_184);
    uVar6 = ircode_register_pop(code_00);
    if (uVar6 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2b4,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar6 = ircode_register_pop(code_00);
    if (uVar6 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2b6,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar6 = ircode_register_pop(code_00);
    if (uVar6 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2b8,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar6 = ircode_newlabel(code_00);
    uVar7 = ircode_newlabel(code_00);
    uVar8 = ircode_newlabel(code_00);
    ircode_setlabel_true(code_00,uVar6);
    ircode_setlabel_false(code_00,uVar7);
    ircode_setlabel_check(code_00,uVar8);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_194 = 0;
    }
    else {
      local_194 = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,uVar6,local_194);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_1ac = 0;
    }
    else {
      local_1ac = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMPF,p1_00,uVar7,1,local_1ac);
    p1_02 = ircode_register_push_temp_protected(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_1c4 = 0;
    }
    else {
      local_1c4 = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,p1_02,p1_01,0,local_1c4);
    p1_03 = ircode_register_push_temp_protected(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_1dc = 0;
    }
    else {
      local_1dc = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,p1_03,p1,0,local_1dc);
    p1_04 = ircode_register_push_temp_protected(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_1f4 = 0;
    }
    else {
      local_1f4 = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,p1_04,p1_00,0,local_1f4);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_20c = 0;
    }
    else {
      local_20c = (node->base).token.lineno;
    }
    ircode_add(code_00,CALL,uVar4,p1_02,2,local_20c);
    gvisit(self,node->stmt);
    ircode_register_temp_unprotect(code_00,p1_04);
    ircode_register_temp_unprotect(code_00,p1_03);
    ircode_register_temp_unprotect(code_00,p1_02);
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2d9,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2db,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2dd,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_21c = 0;
    }
    else {
      local_21c = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,uVar8,local_21c);
    uVar4 = ircode_register_push_temp(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_234 = 0;
    }
    else {
      local_234 = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,uVar4,uVar5,0,local_234);
    uVar8 = ircode_register_push_temp(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_24c = 0;
    }
    else {
      local_24c = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,uVar8,p1,0,local_24c);
    uVar8 = ircode_register_push_temp(code_00);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_264 = 0;
    }
    else {
      local_264 = (node->base).token.lineno;
    }
    ircode_add(code_00,MOVE,uVar8,p1_00,0,local_264);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_27c = 0;
    }
    else {
      local_27c = (node->base).token.lineno;
    }
    ircode_add(code_00,CALL,p1_00,uVar4,2,local_27c);
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2ea,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2ec,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2ee,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_28c = 0;
    }
    else {
      local_28c = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMP,uVar6,0,0,local_28c);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_29c = 0;
    }
    else {
      local_29c = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,uVar7,local_29c);
    ircode_unsetlabel_true(code_00);
    ircode_unsetlabel_false(code_00);
    ircode_unsetlabel_check(code_00);
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2f9,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2fb,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2fd,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    uVar4 = ircode_register_pop(code_00);
    if (uVar4 == 0xffffffff) {
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,0x2ff,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
    ircode_register_temp_unprotect(code_00,p1);
    ircode_register_temp_unprotect(code_00,p1_00);
    ircode_register_temp_unprotect(code_00,uVar5);
    ircode_register_temp_unprotect(code_00,p1_01);
    if (node->nclose != 0xffffffff) {
      if (node == (gnode_loop_stmt_t *)0x0) {
        local_2ac = 0;
      }
      else {
        local_2ac = (node->base).token.lineno;
      }
      ircode_add(code_00,CLOSE,node->nclose,0,0,local_2ac);
    }
  }
  return;
}

Assistant:

static void visit_loop_for_stmt (gvisitor_t *self, gnode_loop_stmt_t *node) {
    // https://www.natashatherobot.com/swift-alternatives-to-c-style-for-loops/

    DEBUG_CODEGEN("visit_loop_for_stmt");
    DECLARE_CODE();

    // FOR loop is transformed to a WHILE loop
    //
    // from:
    // for (cond in expr) {
    //    stmp;
    // }
    //
    // to:
    // {
    //    var $expr = expr;
    //    var $value = $expr.iterate(null);
    //    while ($value) {
    //        cond = $expr.next($value);
    //        stmp;
    //        $value = $expr.iterate($value);
    //    }
    // }

    // $expr and $value are temporary registers that must be protected, otherwise
    // in visit_compound_statement, all temp registers are released within ircode_register_temps_clear
    uint32_t $expr = ircode_register_push_temp_protected(code);     // ++TEMP => 1
    uint32_t $value = ircode_register_push_temp_protected(code);    // ++TEMP => 2

    // get cpool index for the required methods
    uint16_t iterate_idx = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, ITERATOR_INIT_FUNCTION));
    uint16_t next_idx = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, ITERATOR_NEXT_FUNCTION));
    uint32_t cond_idx = node2index(node->cond);

    // generate code for $expr = expr (so expr is only evaluated once)
    visit(node->expr);
    uint32_t once_expr = ircode_register_pop(code);
    if (once_expr == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid for expression.");
	ircode_add(code, MOVE, $expr, once_expr, 0, LINE_NUMBER(node));

    // generate code for $value = $expr.iterate(null);
    uint32_t iterate_fn = ircode_register_push_temp_protected(code);    // ++TEMP => 3
	ircode_add(code, LOADK, iterate_fn, iterate_idx, 0, LINE_NUMBER(node));
	ircode_add(code, LOAD, iterate_fn, $expr, iterate_fn, LINE_NUMBER(node));

    uint32_t next_fn = ircode_register_push_temp_protected(code);       // ++TEMP => 4
	ircode_add(code, LOADK, next_fn, next_idx, 0, LINE_NUMBER(node));
	ircode_add(code, LOAD, next_fn, $expr, next_fn, LINE_NUMBER(node));

    uint32_t temp1 = ircode_register_push_temp(code);                   // ++TEMP => 5
	ircode_add(code, MOVE, temp1, iterate_fn, 0, LINE_NUMBER(node));
    uint32_t temp2 = ircode_register_push_temp(code);                   // ++TEMP => 6
	ircode_add(code, MOVE, temp2, $expr, 0, LINE_NUMBER(node));
    uint32_t temp3 = ircode_register_push_temp(code);                   // ++TEMP => 7
	ircode_add(code, LOADK, temp3, CPOOL_VALUE_NULL, 0, LINE_NUMBER(node));
	ircode_add(code, CALL, $value, temp1, 2, LINE_NUMBER(node));
    uint32_t temp = ircode_register_pop(code);                          // --TEMP => 6
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 5
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 4
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

    // while code
    uint32_t labelTrue  = ircode_newlabel(code);
    uint32_t labelFalse = ircode_newlabel(code);
    uint32_t labelCheck = ircode_newlabel(code);
    ircode_setlabel_true(code, labelTrue);
    ircode_setlabel_false(code, labelFalse);
    ircode_setlabel_check(code, labelCheck);

	ircode_marklabel(code, labelTrue, LINE_NUMBER(node));
	ircode_add(code, JUMPF, $value, labelFalse, 1, LINE_NUMBER(node));				// flag JUMPF instruction to check ONLY BOOL values

    // cond = $expr.next($value);
    // cond is a local variable
    temp1 = ircode_register_push_temp_protected(code);                  // ++TEMP => 5
	ircode_add(code, MOVE, temp1, next_fn, 0, LINE_NUMBER(node));
    temp2 = ircode_register_push_temp_protected(code);                  // ++TEMP => 6
	ircode_add(code, MOVE, temp2, $expr, 0, LINE_NUMBER(node));
    temp3 = ircode_register_push_temp_protected(code);                  // ++TEMP => 7
	ircode_add(code, MOVE, temp3, $value, 0, LINE_NUMBER(node));
	ircode_add(code, CALL, cond_idx, temp1, 2, LINE_NUMBER(node));
    
    // process statement
    visit(node->stmt);
    
    // temp registers can now be released
    ircode_register_temp_unprotect(code, temp3);
    ircode_register_temp_unprotect(code, temp2);
    ircode_register_temp_unprotect(code, temp1);

    // pop next_fn temp register AFTER user code because function ptr must be protected inside loop
    temp = ircode_register_pop(code);                                   // --TEMP => 6
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 5
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 4
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

    ircode_marklabel(code, labelCheck, LINE_NUMBER(node));
    // update $value for the next check
    // $value = $expr.iterate($value);
    temp1 = ircode_register_push_temp(code);                            // ++TEMP => 5
	ircode_add(code, MOVE, temp1, iterate_fn, 0, LINE_NUMBER(node));
    temp2 = ircode_register_push_temp(code);                            // ++TEMP => 6
	ircode_add(code, MOVE, temp2, $expr, 0, LINE_NUMBER(node));
    temp2 = ircode_register_push_temp(code);                            // ++TEMP => 7
	ircode_add(code, MOVE, temp2, $value, 0, LINE_NUMBER(node));
	ircode_add(code, CALL, $value, temp1, 2, LINE_NUMBER(node));
    temp = ircode_register_pop(code);                                   // --TEMP => 6
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 5
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 4
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

	ircode_add(code, JUMP, labelTrue, 0, 0, LINE_NUMBER(node));

	ircode_marklabel(code, labelFalse, LINE_NUMBER(node));

    ircode_unsetlabel_true(code);
    ircode_unsetlabel_false(code);
    ircode_unsetlabel_check(code);

    temp = ircode_register_pop(code);                                   // --TEMP => 3
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 2
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 1
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
    temp = ircode_register_pop(code);                                   // --TEMP => 0
    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

    // mark main for registers as reusable
    ircode_register_temp_unprotect(code, $expr);
    ircode_register_temp_unprotect(code, $value);
    ircode_register_temp_unprotect(code, iterate_fn);
    ircode_register_temp_unprotect(code, next_fn);

    if (node->nclose != UINT32_MAX) {
		ircode_add(code, CLOSE, node->nclose, 0, 0, LINE_NUMBER(node));
    }
}